

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

int __thiscall Fl_Text_Display::position_to_line(Fl_Text_Display *this,int pos,int *lineNum)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int *piVar4;
  bool bVar5;
  
  uVar2 = 0;
  bVar5 = false;
  while( true ) {
    *lineNum = 0;
    if (pos < this->mFirstChar) break;
    uVar3 = (ulong)(uint)this->mNVisibleLines;
    iVar1 = this->mLastChar;
    if (pos <= iVar1) {
      piVar4 = this->mLineStarts + uVar3;
      goto LAB_001cdf28;
    }
    if ((this->mNVisibleLines < 1) || (this->mLineStarts[uVar3 - 1] != -1)) break;
    if (iVar1 < this->mBuffer->mLength) {
      iVar1 = position_to_line(this,iVar1,lineNum);
      if (iVar1 == 0) {
        (*Fl::error)("Fl_Text_Display::position_to_line(): Consistency check ptvl failed");
        uVar2 = 0;
      }
      else {
        iVar1 = *lineNum;
        *lineNum = iVar1 + 1;
        uVar2 = (uint)(iVar1 < this->mNVisibleLines + -1);
      }
      break;
    }
    pos = Fl_Text_Buffer::prev_char_clipped(this->mBuffer,iVar1);
    bVar5 = true;
  }
  goto LAB_001cdf8f;
  while( true ) {
    uVar2 = (int)uVar3 - 1;
    uVar3 = (ulong)uVar2;
    if (*piVar4 <= pos && *piVar4 != -1) break;
LAB_001cdf28:
    piVar4 = piVar4 + -1;
    uVar2 = 0;
    if ((int)uVar3 < 1) goto LAB_001cdf8f;
  }
  *lineNum = uVar2;
  uVar2 = 1;
LAB_001cdf8f:
  if (bVar5) {
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

int Fl_Text_Display::position_to_line( int pos, int *lineNum ) const {
  IS_UTF8_ALIGNED2(buffer(), pos)

  int i;

  *lineNum = 0;
  if ( pos < mFirstChar ) return 0;
  if ( pos > mLastChar ) {
    if ( empty_vlines() ) {
      if ( mLastChar < mBuffer->length() ) {
        if ( !position_to_line( mLastChar, lineNum ) ) {
          Fl::error("Fl_Text_Display::position_to_line(): Consistency check ptvl failed");
          return 0;
        }
        return ++( *lineNum ) <= mNVisibleLines - 1;
      } else {
        position_to_line( buffer()->prev_char_clipped(mLastChar), lineNum );
        return 1;
      }
    }
    return 0;
  }

  for ( i = mNVisibleLines - 1; i >= 0; i-- ) {
    if ( mLineStarts[ i ] != -1 && pos >= mLineStarts[ i ] ) {
      *lineNum = i;
      return 1;
    }
  }
  return 0;   /* probably never be reached */
}